

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O1

void verify_sparse_file2(archive *a,char *path,sparse *sparse,int blocks,int preopen)

{
  int fd;
  int iVar1;
  wchar_t wVar2;
  archive_entry *entry;
  
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'ǎ',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_pathname(entry,"file0");
  if ((int)sparse == 0) {
    fd = -1;
  }
  else {
    fd = open("file0",0);
  }
  iVar1 = archive_read_disk_entry_from_file(a,entry,fd,(stat_conflict *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'Ǖ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_disk_entry_from_file(a, ae, fd, NULL)",a);
  if (-1 < fd) {
    close(fd);
  }
  failure("%s","file0");
  wVar2 = archive_entry_sparse_count(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'ǜ',(ulong)path & 0xffffffff,"blocks",(long)wVar2,
                      "archive_entry_sparse_count(ae)",(void *)0x0);
  archive_entry_free(entry);
  return;
}

Assistant:

static void
verify_sparse_file2(struct archive *a, const char *path,
    const struct sparse *sparse, int blocks, int preopen)
{
	struct archive_entry *ae;
	int fd;

	(void)sparse; /* UNUSED */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, path);
	if (preopen)
		fd = open(path, O_RDONLY | O_BINARY);
	else
		fd = -1;
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_disk_entry_from_file(a, ae, fd, NULL));
	if (fd >= 0)
		close(fd);
	/* Verify the number of holes only, not its offset nor its
	 * length because those alignments are deeply dependence on
	 * its filesystem. */ 
	failure("%s", path);
	assertEqualInt(blocks, archive_entry_sparse_count(ae));
	archive_entry_free(ae);
}